

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O1

void __thiscall QBuffer::setData(QBuffer *this,char *data,qsizetype size)

{
  QObjectData *pQVar1;
  QBindingStatus *pQVar2;
  bool bVar3;
  
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  bVar3 = QIODevice::isOpen(&this->super_QIODevice);
  if (bVar3) {
    setData();
  }
  else {
    pQVar2 = pQVar1[4].bindingStorage.bindingStatus;
    QArrayDataPointer<char>::assign<char_const*,q20::identity>
              ((QArrayDataPointer<char> *)pQVar2,data,data + size);
    if (pQVar2->currentCompatProperty != (CompatPropertySafePoint *)0x0) {
      *(char *)((long)&pQVar2->currentCompatProperty->property + (long)pQVar2->threadId) = '\0';
    }
  }
  return;
}

Assistant:

void QBuffer::setData(const char *data, qsizetype size)
{
    Q_D(QBuffer);
    if (isOpen()) {
        qWarning("QBuffer::setData: Buffer is open");
        return;
    }
    d->buf->assign(data, data + size);
}